

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O1

EVdfg_stone EVdfg_create_sink_stone(EVdfg dfg,char *handler_name)

{
  CManager cm;
  EVdfg_stone p_Var1;
  
  cm = dfg->master->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x453);
  p_Var1 = INT_EVdfg_create_sink_stone(dfg,handler_name);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x455);
  return p_Var1;
}

Assistant:

extern EVdfg_stone
EVdfg_create_sink_stone ( EVdfg dfg, char *handler_name )
{
	EVdfg_stone ret;
	CManager cm = dfg->master->cm;
	CManager_lock(cm);
	ret = INT_EVdfg_create_sink_stone(dfg, handler_name);
	CManager_unlock(cm);
	return ret;
}